

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_shutdown.c
# Opt level: O1

void routine(void *arg)

{
  int line;
  int iVar1;
  char *in_RCX;
  int extraout_EDX;
  int extraout_EDX_00;
  int sock;
  
  line = nn_socket(1,0x21);
  iVar1 = extraout_EDX;
  if (line < 0) {
    iVar1 = nn_errno();
    if (iVar1 == 0x18) {
      return;
    }
    iVar1 = extraout_EDX_00;
    if (line < 0) {
      routine_cold_1();
    }
  }
  test_connect_impl((char *)0x32,line,iVar1,in_RCX);
  test_close_impl((char *)0x33,line,sock);
  return;
}

Assistant:

static void routine (NN_UNUSED void *arg)
{
    int s;

    s = nn_socket (AF_SP, NN_SUB);
    if (s < 0 && nn_errno () == EMFILE)
        return;
    errno_assert (s >= 0);
    test_connect (s, SOCKET_ADDRESS);
    test_close (s);
}